

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O0

Module __thiscall tvm::runtime::TVMRetValue::operator_cast_to_Module(TVMRetValue *this)

{
  bool bVar1;
  ostringstream *poVar2;
  ostream *poVar3;
  char *pcVar4;
  Module *pMVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  TVMPODValue_ *in_RSI;
  Module MVar6;
  LogMessageFatal local_1c0;
  anon_enum_32 local_24;
  LogCheckError local_20;
  LogCheckError _check_err;
  TVMRetValue *this_local;
  
  local_24 = kModuleHandle;
  dmlc::LogCheck_EQ<int,TVMTypeCode>((dmlc *)&local_20,&in_RSI->type_code_,&local_24);
  bVar1 = dmlc::LogCheckError::operator_cast_to_bool(&local_20);
  if (bVar1) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_1c0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/include/tvm/runtime/packed_func.h"
               ,0x2a5);
    poVar2 = dmlc::LogMessageFatal::stream_abi_cxx11_(&local_1c0);
    poVar3 = std::operator<<((ostream *)poVar2,"Check failed: ");
    poVar3 = std::operator<<(poVar3,"type_code_ == kModuleHandle");
    poVar3 = std::operator<<(poVar3,(string *)local_20.str);
    poVar3 = std::operator<<(poVar3,": ");
    poVar3 = std::operator<<(poVar3," expected ");
    pcVar4 = TypeCode2Str(9);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3," but get ");
    pcVar4 = TypeCode2Str(in_RSI->type_code_);
    std::operator<<(poVar3,pcVar4);
    dmlc::LogMessageFatal::~LogMessageFatal(&local_1c0);
  }
  dmlc::LogCheckError::~LogCheckError(&local_20);
  pMVar5 = TVMPODValue_::ptr<tvm::runtime::Module>(in_RSI);
  Module::Module((Module *)this,pMVar5);
  MVar6.node_.super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  MVar6.node_.super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Module)MVar6.node_.
                 super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

operator Module() const {
    TVM_CHECK_TYPE_CODE(type_code_, kModuleHandle);
    return *ptr<Module>();
  }